

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkQueryUtil.cpp
# Opt level: O2

vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *
vk::enumerateDeviceLayerProperties
          (vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
           *__return_storage_ptr__,InstanceInterface *vki,VkPhysicalDevice physicalDevice)

{
  VkResult VVar1;
  long lVar2;
  TestError *this;
  deUint32 numLayers;
  
  (__return_storage_ptr__->
  super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  numLayers = 0;
  VVar1 = (*vki->_vptr_InstanceInterface[0xb])(vki,physicalDevice,&numLayers,0);
  checkResult(VVar1,"vki.enumerateDeviceLayerProperties(physicalDevice, &numLayers, DE_NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
              ,0xd3);
  if ((ulong)numLayers != 0) {
    std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::resize
              (__return_storage_ptr__,(ulong)numLayers);
    VVar1 = (*vki->_vptr_InstanceInterface[0xb])
                      (vki,physicalDevice,&numLayers,
                       (__return_storage_ptr__->
                       super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    checkResult(VVar1,
                "vki.enumerateDeviceLayerProperties(physicalDevice, &numLayers, &properties[0])",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                ,0xd8);
    lVar2 = (long)(__return_storage_ptr__->
                  super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>)
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(__return_storage_ptr__->
                  super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
    if (lVar2 / 0x208 != (ulong)numLayers) {
      this = (TestError *)__cxa_allocate_exception(0x38,0x208,lVar2 % 0x208);
      tcu::TestError::TestError
                (this,(char *)0x0,"(size_t)numLayers == properties.size()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                 ,0xd9);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<VkLayerProperties> enumerateDeviceLayerProperties (const InstanceInterface& vki, VkPhysicalDevice physicalDevice)
{
	vector<VkLayerProperties>	properties;
	deUint32					numLayers	= 0;

	VK_CHECK(vki.enumerateDeviceLayerProperties(physicalDevice, &numLayers, DE_NULL));

	if (numLayers > 0)
	{
		properties.resize(numLayers);
		VK_CHECK(vki.enumerateDeviceLayerProperties(physicalDevice, &numLayers, &properties[0]));
		TCU_CHECK((size_t)numLayers == properties.size());
	}

	return properties;
}